

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_template.h
# Opt level: O0

Int128 * helper_atomic_cmpxchgo_le_mmu_ppc64
                   (Int128 *__return_storage_ptr__,CPUArchState_conflict21 *env,target_ulong addr,
                   Int128 cmpv,Int128 newv,TCGMemOpIdx oi,uintptr_t retaddr)

{
  undefined1 cmp [16];
  undefined1 new [16];
  Int128 *pIVar1;
  undefined8 in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  Int128 ret;
  Int128 *haddr;
  Int128 newv_local;
  Int128 cmpv_local;
  target_ulong addr_local;
  CPUArchState_conflict21 *env_local;
  
  pIVar1 = (Int128 *)
           atomic_mmu_lookup((CPUArchState_conflict21 *)__return_storage_ptr__,(target_ulong)env,
                             (TCGMemOpIdx)cmpv,cmpv._8_8_);
  cmp._8_8_ = env;
  cmp._0_8_ = in_stack_ffffffffffffff38;
  new._8_8_ = in_stack_ffffffffffffff50;
  new._0_8_ = in_stack_ffffffffffffff48;
  pIVar1 = atomic16_cmpxchg(pIVar1,(Int128 *)addr,(Int128)cmp,(Int128)new);
  return pIVar1;
}

Assistant:

ABI_TYPE ATOMIC_NAME(cmpxchg)(CPUArchState *env, target_ulong addr,
                              ABI_TYPE cmpv, ABI_TYPE newv EXTRA_ARGS)
{
    ATOMIC_MMU_DECLS;
    DATA_TYPE *haddr = ATOMIC_MMU_LOOKUP;
    DATA_TYPE ret;

#if DATA_SIZE == 16
    ret = atomic16_cmpxchg(haddr, cmpv, newv);
#else
#ifdef _MSC_VER
    ret = atomic_cmpxchg__nocheck((long *)haddr, cmpv, newv);
#else
    ret = atomic_cmpxchg__nocheck(haddr, cmpv, newv);
#endif
#endif
    ATOMIC_MMU_CLEANUP;
    return ret;
}